

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smpdtfmt.cpp
# Opt level: O0

int32_t __thiscall
icu_63::SimpleDateFormat::matchDayPeriodStrings
          (SimpleDateFormat *this,UnicodeString *text,int32_t start,UnicodeString *data,
          int32_t dataCount,int32_t *dayPeriod)

{
  int32_t iVar1;
  int local_4c;
  int32_t matchLength;
  int32_t i;
  int32_t bestMatch;
  int32_t bestMatchLength;
  int32_t *dayPeriod_local;
  int32_t dataCount_local;
  UnicodeString *data_local;
  int32_t start_local;
  UnicodeString *text_local;
  SimpleDateFormat *this_local;
  
  i = 0;
  matchLength = -1;
  for (local_4c = 0; local_4c < dataCount; local_4c = local_4c + 1) {
    iVar1 = matchStringWithOptionalDot(text,start,data + local_4c);
    if (i < iVar1) {
      matchLength = local_4c;
      i = iVar1;
    }
  }
  if (matchLength < 0) {
    this_local._4_4_ = -start;
  }
  else {
    *dayPeriod = matchLength;
    this_local._4_4_ = start + i;
  }
  return this_local._4_4_;
}

Assistant:

int32_t SimpleDateFormat::matchDayPeriodStrings(const UnicodeString& text, int32_t start,
                              const UnicodeString* data, int32_t dataCount,
                              int32_t &dayPeriod) const
{

    int32_t bestMatchLength = 0, bestMatch = -1;

    for (int32_t i = 0; i < dataCount; ++i) {
        int32_t matchLength = 0;
        if ((matchLength = matchStringWithOptionalDot(text, start, data[i])) > bestMatchLength) {
            bestMatchLength = matchLength;
            bestMatch = i;
        }
    }

    if (bestMatch >= 0) {
        dayPeriod = bestMatch;
        return start + bestMatchLength;
    }

    return -start;
}